

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

QMdiSubWindow * __thiscall
QMdiAreaPrivate::nextVisibleSubWindow
          (QMdiAreaPrivate *this,int increaseFactor,WindowOrder order,int removedIndex,int fromIndex
          )

{
  QMdiArea *this_00;
  QPointer<QMdiSubWindow> *pQVar1;
  Data *pDVar2;
  int iVar3;
  undefined1 *puVar4;
  qsizetype qVar5;
  int iVar6;
  int iVar7;
  QObject *pQVar8;
  QMdiSubWindow *pQVar9;
  int iVar10;
  long in_FS_OFFSET;
  QObject *local_60;
  QArrayDataPointer<QMdiSubWindow_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->childWindows).d.size == 0) {
    pQVar9 = (QMdiSubWindow *)0x0;
    goto LAB_0040d43a;
  }
  this_00 = *(QMdiArea **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QMdiSubWindow **)&DAT_aaaaaaaaaaaaaaaa;
  QMdiArea::subWindowList((QList<QMdiSubWindow_*> *)&local_58,this_00,order);
  local_60 = (QObject *)0x0;
  if (removedIndex < 0) {
    if ((fromIndex < 0) ||
       (puVar4 = (undefined1 *)(ulong)(uint)fromIndex, (ulong)local_58.size <= puVar4)) {
      local_60 = (QObject *)QMdiArea::currentSubWindow(this_00);
    }
    else {
      pQVar1 = (this->childWindows).d.ptr;
      pDVar2 = pQVar1[(long)puVar4].wp.d;
      if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) goto LAB_0040d383;
      local_60 = pQVar1[(long)puVar4].wp.value;
    }
    if (local_60 == (QObject *)0x0) goto LAB_0040d383;
  }
  else if (order == CreationOrder) {
    local_60 = (QObject *)0x0;
    pQVar8 = (QObject *)(ulong)(uint)removedIndex;
    if ((int)local_58.size + -1 < removedIndex) {
      pQVar8 = local_60;
    }
    pQVar1 = (this->childWindows).d.ptr;
    pDVar2 = pQVar1[(long)pQVar8].wp.d;
    if (pDVar2 != (Data *)0x0) {
      if (*(int *)(pDVar2 + 4) == 0) {
        local_60 = (QObject *)0x0;
      }
      else {
        local_60 = pQVar1[(long)pQVar8].wp.value;
      }
    }
  }
  else {
LAB_0040d383:
    local_60 = (QObject *)local_58.ptr[(long)(local_58.size + -1)];
  }
  qVar5 = QtPrivate::indexOf<QMdiSubWindow*,QMdiSubWindow*>
                    ((QList<QMdiSubWindow_*> *)&local_58,(QMdiSubWindow **)&local_60,0);
  iVar3 = (int)qVar5;
  iVar7 = iVar3 + increaseFactor;
  iVar6 = (int)local_58.size + -1;
  if (increaseFactor < 1) {
    iVar10 = iVar6;
    if ((-1 < iVar7) && (iVar10 = iVar7, iVar6 <= iVar7)) {
      iVar10 = iVar6;
    }
  }
  else {
    iVar10 = 0;
    if ((iVar7 <= iVar6) && (iVar10 = 0, 0 < iVar7)) {
      iVar10 = iVar7;
    }
  }
  do {
    pQVar9 = local_58.ptr[iVar10];
    if ((((local_58.ptr[iVar10]->super_QWidget).data)->widget_attributes & 0x10000) == 0)
    goto LAB_0040d430;
    iVar7 = iVar10 + increaseFactor;
    if (increaseFactor < 1) {
      iVar10 = iVar6;
      if ((-1 < iVar7) && (iVar10 = iVar7, iVar6 <= iVar7)) {
        iVar10 = iVar6;
      }
    }
    else {
      iVar10 = 0;
      if ((iVar7 <= iVar6) && (iVar10 = iVar7, iVar7 < 1)) {
        iVar10 = 0;
      }
    }
  } while (iVar10 != iVar3);
  pQVar9 = (QMdiSubWindow *)0x0;
  if ((((local_58.ptr[iVar3]->super_QWidget).data)->widget_attributes & 0x10000) == 0) {
    pQVar9 = local_58.ptr[iVar3];
  }
LAB_0040d430:
  QArrayDataPointer<QMdiSubWindow_*>::~QArrayDataPointer(&local_58);
LAB_0040d43a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar9;
}

Assistant:

QMdiSubWindow *QMdiAreaPrivate::nextVisibleSubWindow(int increaseFactor, QMdiArea::WindowOrder order,
                                                     int removedIndex, int fromIndex) const
{
    if (childWindows.isEmpty())
        return nullptr;

    Q_Q(const QMdiArea);
    const QList<QMdiSubWindow *> subWindows = q->subWindowList(order);
    QMdiSubWindow *current = nullptr;

    if (removedIndex < 0) {
        if (fromIndex >= 0 && fromIndex < subWindows.size())
            current = childWindows.at(fromIndex);
        else
            current = q->currentSubWindow();
    }

    // There's no current sub-window (removed or deactivated),
    // so we have to pick the last active or the next in creation order.
    if (!current) {
        if (removedIndex >= 0 && order == QMdiArea::CreationOrder) {
            int candidateIndex = -1;
            setIndex(&candidateIndex, removedIndex, 0, subWindows.size() - 1, true);
            current = childWindows.at(candidateIndex);
        } else {
            current = subWindows.back();
        }
    }
    Q_ASSERT(current);

    // Find the index for the current sub-window in the given activation order
    const int indexToCurrent = subWindows.indexOf(current);
    const bool increasing = increaseFactor > 0;

    // and use that index + increseFactor as a candidate.
    int index = -1;
    setIndex(&index, indexToCurrent + increaseFactor, 0, subWindows.size() - 1, increasing);
    Q_ASSERT(index != -1);

    // Try to find another window if the candidate is hidden.
    while (subWindows.at(index)->isHidden()) {
        setIndex(&index, index + increaseFactor, 0, subWindows.size() - 1, increasing);
        if (index == indexToCurrent)
            break;
    }

    if (!subWindows.at(index)->isHidden())
        return subWindows.at(index);
    return nullptr;
}